

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.cpp
# Opt level: O0

int P_Char_match<P_CharExact>(P_CharExact *p,vector<StateP,_std::allocator<StateP>_> *stk)

{
  bool bVar1;
  int ch;
  reference pvVar2;
  State *st;
  vector<StateP,_std::allocator<StateP>_> *stk_local;
  P_CharExact *p_local;
  
  pvVar2 = std::vector<StateP,_std::allocator<StateP>_>::back(stk);
  ch = State::nextChar(&pvVar2->st);
  bVar1 = P_CharExact::testch(p,ch);
  if ((bVar1) && (bVar1 = State::canAdvance(&pvVar2->st), bVar1)) {
    State::advance(&pvVar2->st);
    pvVar2 = std::vector<StateP,_std::allocator<StateP>_>::back(stk);
    pvVar2->iseq = pvVar2->iseq + 1;
  }
  else {
    std::vector<StateP,_std::allocator<StateP>_>::pop_back(stk);
  }
  return 0;
}

Assistant:

int P_Char_match(const P& p, vector<StateP> &stk) {
    State &st = stk.back().st;
    if (p.testch(st.nextChar()) && st.canAdvance()) {
        st.advance();
        stk.back().iseq++;
    } else {
        stk.pop_back();
    }
    return 0;
}